

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

int __thiscall
fmt::v11::basic_string_view<char>::compare
          (basic_string_view<char> *this,basic_string_view<char> other)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  uint uVar4;
  
  uVar3 = other.size_;
  uVar1 = this->size_;
  __n = uVar3;
  if (uVar1 < uVar3) {
    __n = uVar1;
  }
  uVar4 = -(uint)(uVar1 < uVar3) | 1;
  if (uVar1 == uVar3) {
    uVar4 = 0;
  }
  uVar2 = memcmp(this->data_,other.data_,__n);
  if (uVar2 == 0) {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR auto compare(basic_string_view other) const -> int {
    int result =
        detail::compare(data_, other.data_, min_of(size_, other.size_));
    if (result != 0) return result;
    return size_ == other.size_ ? 0 : (size_ < other.size_ ? -1 : 1);
  }